

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.h
# Opt level: O2

void emitter_indent(emitter_t *emitter)

{
  int iVar1;
  char *pcVar2;
  bool bVar3;
  
  bVar3 = emitter->output != emitter_output_json;
  pcVar2 = anon_var_dwarf_4b102f7 + 7;
  if (bVar3) {
    pcVar2 = " ";
  }
  iVar1 = emitter->nesting_depth << bVar3;
  if (emitter->nesting_depth << bVar3 < 1) {
    iVar1 = 0;
  }
  while (bVar3 = iVar1 != 0, iVar1 = iVar1 + -1, bVar3) {
    emitter_printf(emitter,"%s",pcVar2);
  }
  return;
}

Assistant:

static inline void
emitter_indent(emitter_t *emitter) {
	int amount = emitter->nesting_depth;
	const char *indent_str;
	assert(emitter->output != emitter_output_json_compact);
	if (emitter->output == emitter_output_json) {
		indent_str = "\t";
	} else {
		amount *= 2;
		indent_str = " ";
	}
	for (int i = 0; i < amount; i++) {
		emitter_printf(emitter, "%s", indent_str);
	}
}